

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::error::CodeEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,error *this,Code code)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "OK";
    break;
  case 1:
    __s = "CANCELLED";
    break;
  default:
    __s = "UNKNOWN";
    break;
  case 3:
    __s = "INVALID_ARGUMENT";
    break;
  case 4:
    __s = "DEADLINE_EXCEEDED";
    break;
  case 5:
    __s = "NOT_FOUND";
    break;
  case 6:
    __s = "ALREADY_EXISTS";
    break;
  case 7:
    __s = "PERMISSION_DENIED";
    break;
  case 8:
    __s = "RESOURCE_EXHAUSTED";
    break;
  case 9:
    __s = "FAILED_PRECONDITION";
    break;
  case 10:
    __s = "ABORTED";
    break;
  case 0xb:
    __s = "OUT_OF_RANGE";
    break;
  case 0xc:
    __s = "UNIMPLEMENTED";
    break;
  case 0xd:
    __s = "INTERNAL";
    break;
  case 0xe:
    __s = "UNAVAILABLE";
    break;
  case 0xf:
    __s = "DATA_LOSS";
    break;
  case 0x10:
    __s = "UNAUTHENTICATED";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string CodeEnumToString(error::Code code) {
  switch (code) {
    case OK:
      return "OK";
    case CANCELLED:
      return "CANCELLED";
    case UNKNOWN:
      return "UNKNOWN";
    case INVALID_ARGUMENT:
      return "INVALID_ARGUMENT";
    case DEADLINE_EXCEEDED:
      return "DEADLINE_EXCEEDED";
    case NOT_FOUND:
      return "NOT_FOUND";
    case ALREADY_EXISTS:
      return "ALREADY_EXISTS";
    case PERMISSION_DENIED:
      return "PERMISSION_DENIED";
    case UNAUTHENTICATED:
      return "UNAUTHENTICATED";
    case RESOURCE_EXHAUSTED:
      return "RESOURCE_EXHAUSTED";
    case FAILED_PRECONDITION:
      return "FAILED_PRECONDITION";
    case ABORTED:
      return "ABORTED";
    case OUT_OF_RANGE:
      return "OUT_OF_RANGE";
    case UNIMPLEMENTED:
      return "UNIMPLEMENTED";
    case INTERNAL:
      return "INTERNAL";
    case UNAVAILABLE:
      return "UNAVAILABLE";
    case DATA_LOSS:
      return "DATA_LOSS";
  }

  // No default clause, clang will abort if a code is missing from
  // above switch.
  return "UNKNOWN";
}